

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_util.cpp
# Opt level: O2

void duckdb::ExtensionUtil::RegisterType
               (DatabaseInstance *db,string *type_name,LogicalType *type,
               bind_logical_type_function_t bind_modifiers)

{
  CatalogTransaction transaction;
  Catalog *this;
  CatalogTransaction data;
  CreateTypeInfo info;
  LogicalType local_1f8;
  CatalogTransaction local_1e0;
  string local_1b8;
  CreateTypeInfo local_198;
  
  ::std::__cxx11::string::string((string *)&local_1b8,(string *)type_name);
  LogicalType::LogicalType(&local_1f8,type);
  CreateTypeInfo::CreateTypeInfo(&local_198,&local_1b8,&local_1f8,bind_modifiers);
  LogicalType::~LogicalType(&local_1f8);
  ::std::__cxx11::string::~string((string *)&local_1b8);
  local_198.super_CreateInfo.temporary = true;
  local_198.super_CreateInfo.internal = true;
  this = Catalog::GetSystemCatalog(db);
  CatalogTransaction::GetSystemTransaction(&local_1e0,db);
  transaction.context.ptr = local_1e0.context.ptr;
  transaction.db.ptr = local_1e0.db.ptr;
  transaction.transaction.ptr = local_1e0.transaction.ptr;
  transaction.transaction_id = local_1e0.transaction_id;
  transaction.start_time = local_1e0.start_time;
  Catalog::CreateType(this,transaction,&local_198);
  CreateTypeInfo::~CreateTypeInfo(&local_198);
  return;
}

Assistant:

void ExtensionUtil::RegisterType(DatabaseInstance &db, string type_name, LogicalType type,
                                 bind_logical_type_function_t bind_modifiers) {
	D_ASSERT(!type_name.empty());
	CreateTypeInfo info(std::move(type_name), std::move(type), bind_modifiers);
	info.temporary = true;
	info.internal = true;
	auto &system_catalog = Catalog::GetSystemCatalog(db);
	auto data = CatalogTransaction::GetSystemTransaction(db);
	system_catalog.CreateType(data, info);
}